

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::FileDescriptor::GetSourceLocation
          (FileDescriptor *this,vector<int,_std::allocator<int>_> *path,SourceLocation *out_location
          )

{
  int iVar1;
  Rep *pRVar2;
  SourceCodeInfo_Location *pSVar3;
  LogMessage *pLVar4;
  int *piVar5;
  void **ppvVar6;
  LogFinisher local_a1;
  LogMessage local_a0;
  LogMessage local_68;
  
  internal::CheckNotNull<google::protobuf::SourceLocation>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
             ,0xafa,"\'out_location\' must not be NULL",out_location);
  if (((*(SourceCodeInfo **)(this + 0xb0) != (SourceCodeInfo *)0x0) &&
      (pSVar3 = FileDescriptorTables::GetSourceLocation
                          (*(FileDescriptorTables **)(this + 0xa8),path,
                           *(SourceCodeInfo **)(this + 0xb0)),
      pSVar3 != (SourceCodeInfo_Location *)0x0)) &&
     (iVar1 = (pSVar3->span_).current_size_, iVar1 - 3U < 2)) {
    if (iVar1 < 1) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar4 = internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: (index) < (current_size_): ");
      internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar4);
      internal::LogMessage::~LogMessage(&local_68);
    }
    out_location->start_line = ((pSVar3->span_).rep_)->elements[0];
    if ((pSVar3->span_).current_size_ < 2) {
      internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar4 = internal::LogMessage::operator<<
                         (&local_a0,"CHECK failed: (index) < (current_size_): ");
      internal::LogFinisher::operator=(&local_a1,pLVar4);
      internal::LogMessage::~LogMessage(&local_a0);
    }
    out_location->start_column = *(int *)&((pSVar3->span_).rep_)->field_0xc;
    piVar5 = RepeatedField<int>::Get(&pSVar3->span_,(uint)((pSVar3->span_).current_size_ != 3) * 2);
    out_location->end_line = *piVar5;
    piVar5 = RepeatedField<int>::Get(&pSVar3->span_,(pSVar3->span_).current_size_ + -1);
    out_location->end_column = *piVar5;
    std::__cxx11::string::_M_assign((string *)&out_location->leading_comments);
    std::__cxx11::string::_M_assign((string *)&out_location->trailing_comments);
    pRVar2 = (pSVar3->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
    ppvVar6 = pRVar2->elements;
    if (pRVar2 == (Rep *)0x0) {
      ppvVar6 = (void **)0x0;
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<google::protobuf::internal::RepeatedPtrIterator<std::__cxx11::string_const>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &out_location->leading_detached_comments,ppvVar6,
               ppvVar6 + (pSVar3->leading_detached_comments_).super_RepeatedPtrFieldBase.
                         current_size_);
    return true;
  }
  return false;
}

Assistant:

bool FileDescriptor::GetSourceLocation(const std::vector<int>& path,
                                       SourceLocation* out_location) const {
  GOOGLE_CHECK_NOTNULL(out_location);
  if (source_code_info_) {
    if (const SourceCodeInfo_Location* loc =
        tables_->GetSourceLocation(path, source_code_info_)) {
      const RepeatedField<int32>& span = loc->span();
      if (span.size() == 3 || span.size() == 4) {
        out_location->start_line   = span.Get(0);
        out_location->start_column = span.Get(1);
        out_location->end_line     = span.Get(span.size() == 3 ? 0 : 2);
        out_location->end_column   = span.Get(span.size() - 1);

        out_location->leading_comments = loc->leading_comments();
        out_location->trailing_comments = loc->trailing_comments();
        out_location->leading_detached_comments.assign(
            loc->leading_detached_comments().begin(),
            loc->leading_detached_comments().end());
        return true;
      }
    }
  }
  return false;
}